

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O1

void __thiscall
JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::JustInTimeActor<>
          (JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this)

{
  MFP68901 *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  Preference PVar1;
  long lVar2;
  
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_component_prefers_clocking_0059e0f8
  ;
  this_00 = &this->object_;
  memset(this_00,0,0x98);
  (this->object_).super_Source.observer_ = (Observer *)0x0;
  (this->object_).super_Source._vptr_Source = (_func_int **)&PTR_preferred_clocking_00597708;
  lVar2 = 0x28;
  do {
    *(undefined4 *)((long)((this->object_).timers_ + -2) + lVar2) = 0;
    *(undefined2 *)((long)(this->object_).timers_ + lVar2 + -0x24) = 0;
    *(undefined8 *)((long)(this->object_).timers_ + lVar2 + -0x20) = 0x100000001;
    *(undefined1 *)((long)(this->object_).timers_ + lVar2 + -0x18) = 0;
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0x78);
  (this->object_).timer_ab_control_[0] = '\0';
  (this->object_).timer_ab_control_[1] = '\0';
  (this->object_).timer_cd_control_ = '\0';
  (this->object_).cycles_left_.super_WrappedInt<HalfCycles>.length_ = 0;
  *(undefined8 *)((long)&(this->object_).cycles_left_.super_WrappedInt<HalfCycles>.length_ + 5) = 0;
  (this->object_).interrupt_delegate_ = (InterruptDelegate *)0x0;
  (this->object_).interrupt_enable_ = 0;
  (this->object_).interrupt_pending_ = 0;
  *(undefined8 *)((long)&(this->object_).interrupt_enable_ + 2) = 0;
  *(undefined8 *)((long)&(this->object_).interrupt_mask_ + 2) = 0;
  (this->time_since_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->time_until_event_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->time_overrun_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->is_flushed_ = true;
  this->did_flush_ = false;
  this->clocking_preference_ = JustInTime;
  (this->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
  (this->object_).super_Source.observer_ = &this->super_Observer;
  PVar1 = Motorola::MFP68901::MFP68901::preferred_clocking(this_00);
  UNRECOVERED_JUMPTABLE = *(this->super_Observer)._vptr_Observer;
  (*UNRECOVERED_JUMPTABLE)(this,this_00,(ulong)PVar1,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

JustInTimeActor(Args&&... args) : object_(std::forward<Args>(args)...) {
			if constexpr (std::is_base_of<ClockingHint::Source, T>::value) {
				object_.set_clocking_hint_observer(this);
			}
		}